

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerIdPointsToSet.h
# Opt level: O2

bool __thiscall
dg::pta::PointerIdPointsToSet::add<std::initializer_list<dg::pta::Pointer>>
          (PointerIdPointsToSet *this,initializer_list<dg::pta::Pointer> *C)

{
  bool bVar1;
  bool bVar2;
  Pointer *ptr;
  iterator ptr_00;
  long lVar3;
  
  ptr_00 = C->_M_array;
  bVar2 = false;
  for (lVar3 = C->_M_len << 4; lVar3 != 0; lVar3 = lVar3 + -0x10) {
    bVar1 = add(this,ptr_00);
    bVar2 = (bool)(bVar2 | bVar1);
    ptr_00 = ptr_00 + 1;
  }
  return bVar2;
}

Assistant:

bool add(const ContainerTy &C) {
        bool changed = false;
        for (const auto &ptr : C)
            changed |= add(ptr);
        return changed;
    }